

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalSetFileTime
                    (CPalThread *pThread,HANDLE hFile,FILETIME *lpCreationTime,
                    FILETIME *lpLastAccessTime,FILETIME *lpLastWriteTime)

{
  PAL_ERROR PVar1;
  PAL_ERROR PVar2;
  int iVar3;
  undefined1 local_f8 [8];
  stat stat_buf;
  undefined8 *local_48;
  IDataLock *pLocalDataLock;
  IPalObject *pFileObject;
  CFileProcessLocalData *pLocalData;
  
  pLocalDataLock = (IDataLock *)0x0;
  pFileObject = (IPalObject *)0x0;
  local_48 = (undefined8 *)0x0;
  if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
LAB_00127ac6:
    PVar1 = 6;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00127bb5;
    goto LAB_00127adc;
  }
  PVar1 = (**(code **)(*g_pObjectManager + 0x28))
                    (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalDataLock);
  if ((((PVar1 != 0) ||
       (PVar2 = (*pLocalDataLock->_vptr_IDataLock[3])
                          (pLocalDataLock,pThread,0,&local_48,&pFileObject), PVar1 = PVar2,
       PVar2 != 0)) || (PVar1 = 0x32, lpCreationTime != (FILETIME *)0x0)) ||
     (PVar1 = PVar2, lpLastAccessTime == (FILETIME *)0x0 && lpLastWriteTime == (FILETIME *)0x0))
  goto LAB_00127adc;
  if (lpLastAccessTime == (FILETIME *)0x0 || lpLastWriteTime == (FILETIME *)0x0) {
    if (*(int *)&pFileObject[1]._vptr_IPalObject == -1) goto LAB_00127ac6;
    iVar3 = fstat64(*(int *)&pFileObject[1]._vptr_IPalObject,(stat64 *)local_f8);
    if (iVar3 == 0) goto LAB_00127a15;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00127bb5;
  }
  else {
LAB_00127a15:
    if (lpLastAccessTime == (FILETIME *)0x0) {
      stat_buf.__glibc_reserved[2] = stat_buf.st_blocks;
    }
    else {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00127bb5;
      stat_buf.__glibc_reserved[2] = ((long)*lpLastAccessTime + -0x19db1ded53e8000) / 10000000;
    }
    if (((lpLastWriteTime != (FILETIME *)0x0) && (PAL_InitializeChakraCoreCalled == false)) ||
       (PAL_InitializeChakraCoreCalled == false)) {
LAB_00127bb5:
      abort();
    }
    iVar3 = futimes(*(int *)&pFileObject[1]._vptr_IPalObject,
                    (timeval *)(stat_buf.__glibc_reserved + 2));
    if (iVar3 == 0) goto LAB_00127adc;
  }
  PVar1 = FILEGetLastErrorFromErrno();
LAB_00127adc:
  if (local_48 != (undefined8 *)0x0) {
    (**(code **)*local_48)(local_48,pThread,0);
  }
  if (pLocalDataLock != (IDataLock *)0x0) {
    (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,pThread);
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CorUnix::InternalSetFileTime(
        CPalThread *pThread,
        IN HANDLE hFile,
        IN CONST FILETIME *lpCreationTime,
        IN CONST FILETIME *lpLastAccessTime,
        IN CONST FILETIME *lpLastWriteTime)
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    struct timeval Times[2];
    int fd;
    long nsec;
    struct stat stat_buf;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalSetFileTimeExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetFileTimeExit;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetFileTimeExit;
    }
    
    if (lpCreationTime)
    {
        palError = ERROR_NOT_SUPPORTED;
        goto InternalSetFileTimeExit;
    }

    if( !lpLastAccessTime && !lpLastWriteTime )
    { 
	// if both pointers are NULL, the function simply returns.
        goto InternalSetFileTimeExit;
    }
    else if( !lpLastAccessTime || !lpLastWriteTime )
    {
	// if either pointer is NULL, fstat will need to be called.
	fd = pLocalData->unix_fd;
	if ( fd == -1 )
        {
          TRACE("pLocalData = [%p], fd = %d\n", pLocalData, fd);
          palError = ERROR_INVALID_HANDLE;
          goto InternalSetFileTimeExit;
        } 

	if ( fstat(fd, &stat_buf) != 0 )
    	{
          TRACE("fstat failed on file descriptor %d\n", fd);
          palError = FILEGetLastErrorFromErrno();
          goto InternalSetFileTimeExit;
        }
    }

    if (lpLastAccessTime)
    {
        Times[0].tv_sec = FILEFileTimeToUnixTime( *lpLastAccessTime, &nsec );
        Times[0].tv_usec = nsec / 1000; /* convert to microseconds */
    }
    else
    {
	    Times[0].tv_sec = stat_buf.st_atime;
	    Times[0].tv_usec = ST_ATIME_NSEC(&stat_buf) / 1000;
    }

    if (lpLastWriteTime)
    {
        Times[1].tv_sec = FILEFileTimeToUnixTime( *lpLastWriteTime, &nsec );
        Times[1].tv_usec = nsec / 1000; /* convert to microseconds */
    }
    else
    {
        Times[1].tv_sec = stat_buf.st_mtime;
        Times[1].tv_usec = ST_MTIME_NSEC(&stat_buf) / 1000;
    }

    TRACE("Setting atime = [%ld.%ld], mtime = [%ld.%ld]\n",
          Times[0].tv_sec, Times[0].tv_usec,
          Times[1].tv_sec, Times[1].tv_usec);

#if HAVE_FUTIMES
    if ( futimes(pLocalData->unix_fd, Times) != 0 )
#elif HAVE_UTIMES
    if ( utimes(pLocalData->unix_filename, Times) != 0 )
#else
  #error Operating system not supported
#endif
    {
        palError = FILEGetLastErrorFromErrno();
    }

InternalSetFileTimeExit:
    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}